

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.h
# Opt level: O0

cmCommand * __thiscall cmSeparateArgumentsCommand::Clone(cmSeparateArgumentsCommand *this)

{
  cmCommand *this_00;
  cmSeparateArgumentsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmSeparateArgumentsCommand((cmSeparateArgumentsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmSeparateArgumentsCommand; }